

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O2

string * pbrt::internal::ToString3<double>(double x,double y,double z)

{
  string *in_RDI;
  double *in_R9;
  double local_20;
  double local_18;
  char local_10 [8];
  
  StringPrintf<double&,double&,double&>
            (in_RDI,(pbrt *)"[ %f, %f, %f ]",local_10,&local_18,&local_20,in_R9);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}